

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * operator+=(QString *a,
                    QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString_&>,_char>,_QString_&>
                    *b)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  long lVar3;
  long lVar4;
  QString *pQVar5;
  long lVar6;
  long lVar7;
  char16_t *pcVar8;
  char16_t *pcVar9;
  
  pDVar2 = (a->d).d;
  lVar6 = (a->d).size;
  lVar7 = (b->b->d).size;
  lVar3 = (b->a).a.a.d.size;
  lVar4 = (((b->a).a.b)->d).size;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)lVar6);
  }
  lVar6 = lVar7 + lVar3 + lVar6 + lVar4 + 1;
  pDVar2 = (a->d).d;
  if (pDVar2 == (Data *)0x0) {
    lVar7 = 0;
  }
  else {
    lVar7 = (pDVar2->super_QArrayData).alloc -
            (((long)((long)(a->d).ptr -
                    ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >>
             1) + (a->d).size);
  }
  if (lVar7 < lVar6) {
    if (pDVar2 == (Data *)0x0) {
      lVar7 = 0;
    }
    else {
      lVar7 = (pDVar2->super_QArrayData).alloc * 2;
    }
    if (lVar7 < lVar6) {
      lVar7 = lVar6;
    }
    if (((pDVar2 == (Data *)0x0) ||
        (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       ((pDVar2->super_QArrayData).alloc -
        ((long)((long)(a->d).ptr -
               ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1)
        <= lVar7)) {
      lVar6 = (a->d).size;
      if (lVar7 < lVar6) {
        lVar7 = lVar6;
      }
      QString::reallocData((longlong)a,(AllocationOption)lVar7);
    }
    pDVar2 = (a->d).d;
    if ((pDVar2 != (Data *)0x0) && ((pDVar2->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar2->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
  }
  pDVar2 = (a->d).d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)(a->d).size);
  }
  pcVar9 = (a->d).ptr + (a->d).size;
  lVar6 = (b->a).a.a.d.size;
  if (lVar6 != 0) {
    pcVar8 = (b->a).a.a.d.ptr;
    if (pcVar8 == (char16_t *)0x0) {
      pcVar8 = (char16_t *)&QString::_empty;
    }
    memcpy(pcVar9,pcVar8,lVar6 * 2);
  }
  pcVar9 = pcVar9 + lVar6;
  pQVar5 = (b->a).a.b;
  lVar6 = (pQVar5->d).size;
  if (lVar6 != 0) {
    pcVar8 = (pQVar5->d).ptr;
    if (pcVar8 == (char16_t *)0x0) {
      pcVar8 = (char16_t *)&QString::_empty;
    }
    memcpy(pcVar9,pcVar8,lVar6 * 2);
  }
  pcVar9[lVar6] = (ushort)(byte)(b->a).b;
  lVar7 = (b->b->d).size;
  if (lVar7 != 0) {
    pcVar8 = (b->b->d).ptr;
    if (pcVar8 == (char16_t *)0x0) {
      pcVar8 = (char16_t *)&QString::_empty;
    }
    memcpy(pcVar9 + lVar6 + 1,pcVar8,lVar7 * 2);
  }
  QString::resize((longlong)a);
  return a;
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}